

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix<Rational>::operator==(Matrix<Rational> *this,Matrix<Rational> *a)

{
  bool bVar1;
  int *in_RSI;
  Rational *in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  bool local_1;
  
  if ((*(int *)&(in_RDI->_numerator).digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == *in_RSI) &&
     (*(int *)((long)&(in_RDI->_numerator).digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) == in_RSI[1])) {
    for (uVar2 = 0;
        uVar2 < (uint)(*(int *)((long)&(in_RDI->_numerator).digits.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4) *
                      *(int *)&(in_RDI->_numerator).digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 1) {
      bVar1 = ::operator!=((Rational *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (bVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Matrix<Field>::operator==(const Matrix &a) const
{
    if(M != a.M || N != a.N)
        return false;
    for(unsigned i = 0; i < N * M; ++i)
    {
        if(arr[i] != a.arr[i])
            return false;
    }
    return true;
}